

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O2

void __thiscall test_app::test_views(test_app *this)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  ostringstream oss;
  master m;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"- Testing different views");
  std::endl<char,std::char_traits<char>>(poVar2);
  data::master::master(&m);
  std::__cxx11::string::string(local_2a0,"view_x",(allocator *)&oss);
  cppcms::application::render(this,local_2a0,&m);
  std::__cxx11::string::~string(local_2a0);
  str_abi_cxx11_((string *)&oss,this);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "view x");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/tc_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xd3);
    std::operator<<(poVar2," str()==\"view x\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_2e0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_2c0,"view_y",(allocator *)&oss);
  cppcms::application::render(this,local_2c0,&m);
  std::__cxx11::string::~string(local_2c0);
  str_abi_cxx11_((string *)&oss,this);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "view y");
  std::__cxx11::string::~string((string *)&oss);
  if (bVar1) {
    data::master::~master(&m);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/tc_test.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0xd5);
  std::operator<<(poVar2," str()==\"view y\"");
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,local_2e0);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_views()
	{
		std::cout << "- Testing different views" << std::endl;
		data::master m;
		render("view_x",m);
		TEST(str()=="view x");
		render("view_y",m);
		TEST(str()=="view y");
	}